

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caller.hpp
# Opt level: O3

PyObject * __thiscall
boost::python::detail::caller_arity<1U>::
impl<long_(HFSubConsumer::*)()_const,_boost::python::default_call_policies,_boost::mpl::vector2<long,_NeuralConsumer_&>_>
::operator()(impl<long_(HFSubConsumer::*)()_const,_boost::python::default_call_policies,_boost::mpl::vector2<long,_NeuralConsumer_&>_>
             *this,PyObject *args_,PyObject *param_2)

{
  long lVar1;
  long *plVar2;
  undefined8 uVar3;
  PyObject *pPVar4;
  code *pcVar5;
  
  lVar1 = converter::get_lvalue_from_python
                    ((_object *)args_[1].ob_type,
                     converter::detail::registered_base<NeuralConsumer_const_volatile&>::converters)
  ;
  if (lVar1 != 0) {
    pcVar5 = (code *)(this->m_data).
                     super_compressed_pair_imp<long_(HFSubConsumer::*)()_const,_boost::python::default_call_policies,_2>
                     .first_;
    plVar2 = (long *)(lVar1 + *(long *)&(this->m_data).
                                        super_compressed_pair_imp<long_(HFSubConsumer::*)()_const,_boost::python::default_call_policies,_2>
                                        .field_0x8);
    if (((ulong)pcVar5 & 1) != 0) {
      pcVar5 = *(code **)(pcVar5 + *plVar2 + -1);
    }
    uVar3 = (*pcVar5)(plVar2);
    pPVar4 = (PyObject *)PyLong_FromLong(uVar3);
    return pPVar4;
  }
  return (PyObject *)0x0;
}

Assistant:

PyObject* operator()(PyObject* args_, PyObject*) // eliminate
                                                         // this
                                                         // trailing
                                                         // keyword dict
        {
            typedef typename mpl::begin<Sig>::type first;
            typedef typename first::type result_t;
            typedef typename select_result_converter<Policies, result_t>::type result_converter;
            typedef typename Policies::argument_package argument_package;
            
            argument_package inner_args(args_);

# if N
#  define BOOST_PP_LOCAL_MACRO(i) BOOST_PYTHON_ARG_CONVERTER(i)
#  define BOOST_PP_LOCAL_LIMITS (0, N-1)
#  include BOOST_PP_LOCAL_ITERATE()
# endif 
            // all converters have been checked. Now we can do the
            // precall part of the policy
            if (!m_data.second().precall(inner_args))
                return 0;

            PyObject* result = detail::invoke(
                detail::invoke_tag<result_t,F>()
              , create_result_converter(args_, (result_converter*)0, (result_converter*)0)
              , m_data.first()
                BOOST_PP_ENUM_TRAILING_PARAMS(N, c)
            );
            
            return m_data.second().postcall(inner_args, result);
        }